

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O3

bool __thiscall CFG::containsNode(CFG *this,CfgNode *node)

{
  Type TVar1;
  Addr AVar2;
  CfgNode *pCVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  
  if (node == (CfgNode *)0x0) {
    return false;
  }
  TVar1 = node->m_type;
  if (TVar1 == CFG_HALT) {
    return this->m_haltNode == node;
  }
  if (TVar1 == CFG_EXIT) {
    return this->m_exitNode == node;
  }
  if (TVar1 == CFG_ENTRY) {
    return this->m_entryNode == node;
  }
  AVar2 = CfgNode::node2addr(node);
  p_Var5 = (this->m_nodesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 != (_Base_ptr)0x0) {
    p_Var6 = &(this->m_nodesMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = &p_Var6->_M_header;
    do {
      if (*(ulong *)(p_Var5 + 1) >= AVar2) {
        p_Var4 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[*(ulong *)(p_Var5 + 1) < AVar2];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var4 != p_Var6) && (*(ulong *)(p_Var4 + 1) <= AVar2)) {
      pCVar3 = (CfgNode *)p_Var4[1]._M_parent;
      goto LAB_00104c84;
    }
  }
  pCVar3 = (CfgNode *)0x0;
LAB_00104c84:
  return pCVar3 == node;
}

Assistant:

bool CFG::containsNode(CfgNode* node) {
	if (!node)
		return false;

	switch (node->type()) {
		case CfgNode::CFG_ENTRY:
			return node == m_entryNode;
		case CfgNode::CFG_EXIT:
			return node == m_exitNode;
		case CfgNode::CFG_HALT:
			return node == m_haltNode;
		default:
			CfgNode* tmp = CFG::nodeByAddr(CfgNode::node2addr(node));
			return tmp == node;
	}
}